

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

SUNErrCode SUNMatMatvec_Band(SUNMatrix A,N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  sunrealtype *yd;
  sunrealtype *xd;
  sunrealtype *col_j;
  sunindextype ie;
  sunindextype is;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar3 = N_VGetArrayPointer(in_RSI);
  lVar4 = N_VGetArrayPointer(in_RDX);
  for (local_28 = 0; local_28 < *(long *)*in_RDI; local_28 = local_28 + 1) {
    *(undefined8 *)(lVar4 + local_28 * 8) = 0;
  }
  for (local_30 = 0; local_30 < *(long *)(*in_RDI + 8); local_30 = local_30 + 1) {
    lVar1 = *(long *)(*(long *)(*in_RDI + 0x40) + local_30 * 8);
    lVar2 = *(long *)(*in_RDI + 0x28);
    if (local_30 - *(long *)(*in_RDI + 0x18) < 0) {
      local_60 = 0;
    }
    else {
      local_60 = local_30 - *(long *)(*in_RDI + 0x18);
    }
    if (*(long *)*in_RDI + -1 < local_30 + *(long *)(*in_RDI + 0x20)) {
      local_68 = *(long *)*in_RDI + -1;
    }
    else {
      local_68 = local_30 + *(long *)(*in_RDI + 0x20);
    }
    for (local_28 = local_60; local_28 <= local_68; local_28 = local_28 + 1) {
      *(double *)(lVar4 + local_28 * 8) =
           *(double *)(lVar1 + lVar2 * 8 + (local_28 - local_30) * 8) *
           *(double *)(lVar3 + local_30 * 8) + *(double *)(lVar4 + local_28 * 8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatMatvec_Band(SUNMatrix A, N_Vector x, N_Vector y)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j, is, ie;
  sunrealtype *col_j, *xd, *yd;

  SUNCheck(compatibleMatrixAndVectors(A, x, y), SUN_ERR_ARG_DIMSMISMATCH);

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  yd = N_VGetArrayPointer(y);
  SUNCheckLastErr();

  SUNAssert(xd, SUN_ERR_MEM_FAIL);
  SUNAssert(yd, SUN_ERR_MEM_FAIL);

  /* Perform operation */
  for (i = 0; i < SM_ROWS_B(A); i++) { yd[i] = ZERO; }
  for (j = 0; j < SM_COLUMNS_B(A); j++)
  {
    col_j = SM_COLUMN_B(A, j);
    is    = SUNMAX(0, j - SM_UBAND_B(A));
    ie    = SUNMIN(SM_ROWS_B(A) - 1, j + SM_LBAND_B(A));
    for (i = is; i <= ie; i++) { yd[i] += col_j[i - j] * xd[j]; }
  }
  return SUN_SUCCESS;
}